

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall
IRBuilderAsmJs::BuildInt1Double1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType valueType;
  RegOpnd *pRVar3;
  RegOpnd *pRVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  IRType IVar7;
  undefined6 in_register_00000032;
  OpCode opcode;
  int iVar8;
  
  pRVar3 = BuildSrcOpnd(this,srcRegSlot,TyFloat64);
  IR::Opnd::SetValueType(&pRVar3->super_Opnd,(ValueType)0x108);
  iVar8 = (int)CONCAT62(in_register_00000032,newOpcode);
  pRVar4 = pRVar3;
  if (iVar8 < 0x10e) {
    if (iVar8 == 0x32) {
      IVar7 = TyInt32;
    }
    else {
      if (iVar8 != 0x34) {
        if (iVar8 != 0x10c) {
LAB_004ffeb2:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                             ,0x830,"((0))","(0)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
          opcode = Nop;
          pRVar3 = (RegOpnd *)0x0;
          goto LAB_004fff48;
        }
        goto LAB_004ffe31;
      }
      IVar7 = TyUint32;
    }
    pRVar3 = BuildDstOpnd(this,dstRegSlot,IVar7);
    opcode = Conv_Prim;
  }
  else {
    if (iVar8 != 0x10e) {
      if (iVar8 == 0x114) {
        IVar7 = TyInt32;
      }
      else {
        if (iVar8 != 0x116) goto LAB_004ffeb2;
        IVar7 = TyUint32;
      }
      pRVar3 = BuildDstOpnd(this,dstRegSlot,IVar7);
      opcode = Conv_Prim_Sat;
      goto LAB_004fff48;
    }
LAB_004ffe31:
    pRVar4 = IR::RegOpnd::New(TyFloat64,this->m_func);
    IR::Opnd::SetValueType(&pRVar4->super_Opnd,(ValueType)0x108);
    pIVar6 = IR::Instr::New(TrapIfTruncOverflow,&pRVar4->super_Opnd,&pRVar3->super_Opnd,this->m_func
                           );
    AddInstr(this,pIVar6,offset);
    pRVar3 = BuildDstOpnd(this,dstRegSlot,(newOpcode != Conv_Check_DTI) * '\x04' + TyInt32);
    pRVar3->field_0x18 = pRVar3->field_0x18 | 4;
    opcode = Conv_Prim;
  }
LAB_004fff48:
  valueType = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&pRVar3->super_Opnd,valueType);
  pIVar6 = IR::Instr::New(opcode,&pRVar3->super_Opnd,&pRVar4->super_Opnd,this->m_func);
  AddInstr(this,pIVar6,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildInt1Double1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(srcRegSlot, TyFloat64);
    srcOpnd->SetValueType(ValueType::Float);
    IR::RegOpnd * dstOpnd = nullptr;
    Js::OpCode op = Js::OpCode::Nop;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Conv_DTI:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
        op = Js::OpCode::Conv_Prim;
        break;
    case Js::OpCodeAsmJs::Conv_DTU:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyUint32);
        op = Js::OpCode::Conv_Prim;
        break;
    case Js::OpCodeAsmJs::Conv_Sat_DTI:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
        op = Js::OpCode::Conv_Prim_Sat;
        break;
    case Js::OpCodeAsmJs::Conv_Sat_DTU:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyUint32);
        op = Js::OpCode::Conv_Prim_Sat;
        break;
    case Js::OpCodeAsmJs::Conv_Check_DTI:
    case Js::OpCodeAsmJs::Conv_Check_DTU:
    {
        IR::RegOpnd* tmpDst = IR::RegOpnd::New(TyFloat64, m_func);
        op = Js::OpCode::Conv_Prim;
        tmpDst->SetValueType(ValueType::Float);
        AddInstr(IR::Instr::New(Js::OpCode::TrapIfTruncOverflow, tmpDst, srcOpnd, m_func), offset);
        dstOpnd = BuildDstOpnd(dstRegSlot, newOpcode == Js::OpCodeAsmJs::Conv_Check_DTI ? TyInt32 : TyUint32);
        dstOpnd->m_dontDeadStore = true;
        srcOpnd = tmpDst;
        break;
    }
    default:
        Assume(UNREACHED);
    }
    dstOpnd->SetValueType(ValueType::GetInt(false));
    IR::Instr * instr = IR::Instr::New(op, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);
}